

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

void __thiscall PGSStreamReader::PGSStreamReader(PGSStreamReader *this)

{
  TextToPGSConverter *this_00;
  PGSStreamReader *this_local;
  
  AbstractStreamReader::AbstractStreamReader(&this->super_AbstractStreamReader);
  (this->super_AbstractStreamReader).super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader =
       (_func_int **)&PTR__PGSStreamReader_004421c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_tmpBuffer);
  this->m_avFragmentEnd = (uint8_t *)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_dstRle);
  this->object_width = 0;
  this->object_height = 0;
  std::
  map<unsigned_char,_text_subtitles::YUVQuad,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_text_subtitles::YUVQuad>_>_>
  ::map(&this->m_palette);
  this->m_firstRenderedPacket = true;
  std::vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
  ::vector(&this->m_renderedBlocks);
  std::
  map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  ::map(&this->composition_object_horizontal_position);
  std::
  map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  ::map(&this->composition_object_vertical_position);
  this->m_palleteID = 0;
  this->m_paletteVersion = 0;
  this->m_objectWindowHeight = 0;
  this->m_objectWindowTop = 0;
  (this->super_AbstractStreamReader).m_buffer = (uint8_t *)0x0;
  (this->super_AbstractStreamReader).m_curPos = (uint8_t *)0x0;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  this->m_state = stParsePES;
  this->composition_state = csEpochStart;
  this->m_processedSize = 0;
  (this->super_AbstractStreamReader).m_demuxMode = false;
  this->m_afterPesByte = 0;
  this->m_lastPTS = -1;
  this->m_lastDTS = -1;
  this->m_maxPTS = -1;
  this->m_video_width = 0;
  this->m_video_height = 0;
  this->m_frame_rate = 0.0;
  this->m_newFps = 0.0;
  this->m_scale = 1.0;
  this->m_isNewFrame = false;
  this->m_needRescale = false;
  this->m_imgBuffer = (uint8_t *)0x0;
  this->m_rgbBuffer = (uint8_t *)0x0;
  this->m_scaledRgbBuffer = (uint8_t *)0x0;
  this->m_scaled_width = 0;
  this->m_scaled_height = 0;
  this_00 = (TextToPGSConverter *)operator_new(0xa0);
  text_subtitles::TextToPGSConverter::TextToPGSConverter(this_00,false);
  this->m_render = this_00;
  this->m_renderedData = (uint8_t *)0x0;
  this->m_fontBorder = 0;
  this->m_offsetId = 0xff;
  this->m_forced_on_flag = false;
  this->isSSPG = false;
  this->leftEyeSubStreamIdx = -1;
  this->rightEyeSubStreamIdx = -1;
  this->ssPGOffset = 0xff;
  return;
}

Assistant:

PGSStreamReader::PGSStreamReader()
    : m_avFragmentEnd(nullptr),
      object_width(0),
      object_height(0),
      m_firstRenderedPacket(true),
      m_palleteID(0),
      m_paletteVersion(0),
      m_objectWindowHeight(0),
      m_objectWindowTop(0)
{
    m_curPos = m_buffer = nullptr;
    m_tmpBufferLen = 0;
    m_state = State::stParsePES;
    composition_state = CompositionState::csEpochStart;
    m_processedSize = 0;
    m_demuxMode = false;
    m_afterPesByte = 0;
    // m_supWritedPts = m_supWritedDts = -1;
    m_maxPTS = m_lastDTS = m_lastPTS = -1;
    m_video_width = 0;
    m_video_height = 0;
    m_frame_rate = 0;
    m_newFps = 0;
    m_scale = 1.0;
    m_isNewFrame = false;
    m_needRescale = false;
    m_imgBuffer = nullptr;
    m_rgbBuffer = nullptr;
    m_scaledRgbBuffer = nullptr;
    m_scaled_width = 0;
    m_scaled_height = 0;
    m_render = new TextToPGSConverter(false);
    m_renderedData = nullptr;
    m_fontBorder = 0;
    m_offsetId = 0xff;
    m_forced_on_flag = false;

    // SS PG data
    isSSPG = false;
    leftEyeSubStreamIdx = -1;
    rightEyeSubStreamIdx = -1;
    ssPGOffset = 0xff;
}